

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::PostWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::scan
               (BreakValueDropper *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  _func_void_BreakValueDropper_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_007b3f34:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_007b3bd1:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
                  ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *
                   )self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                         ::scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_007b3f34;
    }
    local_38 = pEVar1 + 2;
    local_40 = ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
               ::scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::BreakValueDropper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
                  *)&(self->
                     super_ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     ).
                     super_PostWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .
                     super_Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_007b3bba;
  case LoopId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_007b3f34;
    }
    goto LAB_007b37a2;
  case BreakId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_007b3f34;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
               ::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::BreakValueDropper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
                  *)&(self->
                     super_ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     ).
                     super_PostWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .
                     super_Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_007b33f5;
  case SwitchId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_007b3f34;
    }
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x007b31a4;
  case CallId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_007b3f34;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_007b3bd1;
        Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
                  ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *
                   )self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                         ::scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_007b3f34;
    }
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_007b3bd1;
        Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
                  ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *
                   )self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                         ::scan,(Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_007b3f34;
    }
    break;
  case LocalSetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3890;
  case GlobalGetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_007b3f34;
    }
    break;
  case GlobalSetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_007b3f34;
    }
    goto LAB_007b37a2;
  case LoadId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_007b3f34;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_007b3b0b;
  case StoreId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3859;
  case ConstId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_007b3f34;
    }
    break;
  case UnaryId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3890;
  case BinaryId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3aeb;
  case SelectId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_007b3f34;
    }
    goto LAB_007b34c5;
  case DropId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3ac3;
  case ReturnId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_007b3f34;
    }
    goto LAB_007b319b;
  case MemorySizeId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_007b3f34;
    }
    break;
  case MemoryGrowId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3ac3;
  case NopId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_007b3f34;
    }
    break;
  case UnreachableId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_007b3f34;
    }
    break;
  case AtomicRMWId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_007b3f34;
    }
    goto LAB_007b392f;
  case AtomicCmpxchgId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3915;
  case AtomicWaitId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3032;
  case AtomicNotifyId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3aeb;
  case AtomicFenceId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_007b3f34;
    }
    break;
  case SIMDExtractId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3890;
  case SIMDReplaceId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_007b3f34;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_007b3af6;
  case SIMDShuffleId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3a69;
  case SIMDTernaryId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3032;
  case SIMDShiftId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3aeb;
  case SIMDLoadId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_007b3f34;
    }
    goto LAB_007b36d7;
  case SIMDLoadStoreLaneId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_007b3f34;
    }
LAB_007b3859:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_007b3b0b;
  case MemoryInitId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_007b3f34;
    }
LAB_007b3915:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)(pEVar1 + 3));
    goto LAB_007b392f;
  case DataDropId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_007b3f34;
    }
    break;
  case MemoryCopyId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_007b3f34;
    }
    goto LAB_007b34c5;
  case MemoryFillId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_007b3f34;
    }
    goto LAB_007b34c5;
  case PopId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_007b3f34;
    }
    break;
  case RefNullId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_007b3f34;
    }
    break;
  case RefIsNullId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3ac3;
  case RefFuncId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_007b3f34;
    }
    break;
  case RefEqId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3a69;
  case TableGetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_007b3f34;
    }
    goto LAB_007b37a2;
  case TableSetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_007b3f34;
    }
    goto LAB_007b392f;
  case TableSizeId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_007b3f34;
    }
    break;
  case TableGrowId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_007b3f34;
    }
LAB_007b392f:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_007b3b0b;
  case TryId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_007b3f34;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_007b3bd1;
        Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
                  ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *
                   )self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                         ::scan,(Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_007b37a2:
    pEVar1 = pEVar1 + 2;
    goto LAB_007b3b0b;
  case ThrowId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_007b3f34;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_007b3bd1;
        Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
                  ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *
                   )self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                         ::scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_007b3f34;
    }
    break;
  case TupleMakeId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_007b3f34;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_007b3bd1;
        Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
                  ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *
                   )self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                         ::scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3ac3;
  case I31NewId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3ac3;
  case I31GetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3ac3;
  case CallRefId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_007b3f34;
    }
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_007b3bd1;
        Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
                  ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *
                   )self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                         ::scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3ac3;
  case RefCastId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3ac3;
  case BrOnId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_007b3f34;
    }
LAB_007b36d7:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_007b3b0b;
  case StructNewId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_007b3f34;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_007b3bd1;
        Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
                  ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *
                   )self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                         ::scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3890;
  case StructSetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3aeb;
  case ArrayNewId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_007b3f34;
    }
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)&pEVar1[1].type);
LAB_007b319b:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x007b31a4:
    if (lVar5 != 0) {
LAB_007b33f5:
      local_40 = ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                 ::scan;
      SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::BreakValueDropper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
                  *)&(self->
                     super_ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     ).
                     super_PostWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .
                     super_Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3243;
  case ArrayNewFixedId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_007b3f34;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_007b3bd1;
        Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
                  ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *
                   )self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                         ::scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3a69;
  case ArraySetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_007b3f34;
    }
    goto LAB_007b34c5;
  case ArrayLenId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3ac3;
  case ArrayCopyId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_007b3f34;
    }
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)(pEVar1 + 3));
    goto LAB_007b2fd4;
  case ArrayFillId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_007b3f34;
    }
LAB_007b2fd4:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)&pEVar1[2].type);
    goto LAB_007b34c5;
  case ArrayInitId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitArrayInit,currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_007b3f34;
    }
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)(pEVar1 + 4));
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)&pEVar1[3].type);
LAB_007b3243:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_007b3b0b;
  case RefAsId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3890;
  case StringNewId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_007b3f34;
    }
    local_38 = pEVar1 + 3;
    local_40 = ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
               ::scan;
    if (*(long *)(pEVar1 + 3) != 0) {
      SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::BreakValueDropper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
                  *)&(self->
                     super_ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     ).
                     super_PostWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .
                     super_Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
               ::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::BreakValueDropper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
                  *)&(self->
                     super_ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     ).
                     super_PostWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .
                     super_Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
               ::scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::BreakValueDropper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
                  *)&(self->
                     super_ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     ).
                     super_PostWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .
                     super_Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_007b3bba;
  case StringConstId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_007b3f34;
    }
    break;
  case StringMeasureId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3890;
  case StringEncodeId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_007b3f34;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
               ::scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
      ::emplace_back<void(*&)(wasm::BreakValueDropper*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BreakValueDropper,wasm::Visitor<wasm::BreakValueDropper,void>>::Task,10ul>
                  *)&(self->
                     super_ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     ).
                     super_PostWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .
                     super_Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_007b3bba:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)pEVar1);
    break;
  case StringConcatId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3a69;
  case StringEqId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3aeb;
  case StringAsId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_007b3f34;
    }
LAB_007b3890:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_007b3b0b;
  case StringWTF8AdvanceId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_007b3f34;
    }
LAB_007b34c5:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)(pEVar1 + 2));
    goto LAB_007b3a69;
  case StringWTF16GetId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_007b3f34;
    }
    goto LAB_007b3a69;
  case StringIterNextId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_007b3f34;
    }
LAB_007b3ac3:
    pEVar1 = pEVar1 + 1;
LAB_007b3b0b:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_007b3f34;
    }
LAB_007b3aeb:
    currp_00 = pEVar1 + 2;
LAB_007b3af6:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_007b3b0b;
  case StringSliceWTFId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_007b3f34;
    }
LAB_007b3032:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_007b3af6;
  case StringSliceIterId:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::
                    doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_007b3f34;
    }
LAB_007b3a69:
    Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>::pushTask
              ((Walker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_> *)
               self,ControlFlowWalker<wasm::BreakValueDropper,_wasm::Visitor<wasm::BreakValueDropper,_void>_>
                    ::scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_007b3b0b;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }